

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetProperty_InternalSimple
               (Var instance,RecyclableObject *object,PropertyId propertyId,Var *value,
               ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  RecyclableObject *pRVar7;
  uint uVar8;
  
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x72f,"(value != nullptr)","value != nullptr");
    if (!bVar3) {
LAB_00ab73c2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar8 = 0;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00ab72c4:
  if (((object->type).ptr)->typeId == TypeIds_Null) goto LAB_00ab73a0;
  iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x12])
                    (object,instance,(ulong)(uint)propertyId,value,0,requestContext);
  if (iVar4 != 0) {
    uVar8 = (uint)(iVar4 == 1);
LAB_00ab7308:
    bVar3 = false;
    goto LAB_00ab730a;
  }
  BVar5 = RecyclableObject::SkipsPrototype(object);
  if (BVar5 != 0) goto LAB_00ab7308;
  pTVar1 = (object->type).ptr;
  if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00ab7383:
    object = (pTVar1->prototype).ptr;
  }
  else {
    if (pTVar1->typeId == TypeIds_Proxy) {
      if ((pTVar1->prototype).ptr ==
          (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nullValue.ptr)
      goto LAB_00ab7383;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x57a,
                                  "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                  ,
                                  "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                 );
      if (!bVar3) goto LAB_00ab73c2;
      *puVar6 = 0;
      goto LAB_00ab7383;
    }
    iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(object);
    object = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
  }
  bVar3 = true;
LAB_00ab730a:
  if (!bVar3) {
LAB_00ab73a0:
    if (uVar8 == 0) {
      pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar7;
    }
    return uVar8;
  }
  goto LAB_00ab72c4;
}

Assistant:

BOOL JavascriptOperators::GetProperty_InternalSimple(Var instance, RecyclableObject* object, PropertyId propertyId, _Outptr_result_maybenull_ Var* value, ScriptContext* requestContext)
    {
        BOOL foundProperty = FALSE;
        Assert(value != nullptr);

        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, nullptr, requestContext);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                break;
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }

        return foundProperty;
    }